

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

void __thiscall QRingChunk::detach(QRingChunk *this)

{
  QArrayData *data;
  qsizetype qVar1;
  char *pcVar2;
  long size;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  size = this->tailOffset - this->headOffset;
  pcVar2 = (this->chunk).d.ptr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  QByteArray::QByteArray(&local_38,pcVar2 + this->headOffset,size);
  data = &((this->chunk).d.d)->super_QArrayData;
  pcVar2 = (this->chunk).d.ptr;
  (this->chunk).d.d = local_38.d.d;
  (this->chunk).d.ptr = local_38.d.ptr;
  qVar1 = (this->chunk).d.size;
  (this->chunk).d.size = local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = pcVar2;
  local_38.d.size = qVar1;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  this->headOffset = 0;
  this->tailOffset = size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingChunk::detach()
{
    Q_ASSERT(isShared());

    const qsizetype chunkSize = size();
    chunk = QByteArray(std::as_const(*this).data(), chunkSize);
    headOffset = 0;
    tailOffset = chunkSize;
}